

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O2

PCASC_FILE_NODE __thiscall
CASC_FILE_TREE::Insert
          (CASC_FILE_TREE *this,PCONTENT_KEY pCKey,ULONGLONG NameHash,DWORD DataId,DWORD FileSize,
          DWORD LocaleId)

{
  PCASC_FILE_NODE p_Var1;
  
  p_Var1 = GetOrInsert(this,NameHash,(char *)0x0,(char *)0x0,pCKey,0,DataId);
  if (p_Var1 != (PCASC_FILE_NODE)0x0) {
    if (this->FileSizeOffset != 0) {
      *(DWORD *)((p_Var1->CKey).Value + this->FileSizeOffset) = FileSize;
    }
    if (this->LocaleIdOffset != 0) {
      *(DWORD *)((p_Var1->CKey).Value + this->LocaleIdOffset) = LocaleId;
    }
  }
  return p_Var1;
}

Assistant:

PCASC_FILE_NODE CASC_FILE_TREE::Insert(PCONTENT_KEY pCKey, ULONGLONG NameHash, DWORD DataId, DWORD FileSize, DWORD LocaleId)
{
    PCASC_FILE_NODE pFileNode;
    
    pFileNode = GetOrInsert(NameHash, NULL, NULL, pCKey, 0, DataId);
    if(pFileNode != NULL)
    {
        SetExtras(pFileNode, FileSize, LocaleId);
    }

    return pFileNode;
}